

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *os,color3d *v)

{
  ostream *poVar1;
  char *this;
  _anonymous_namespace_ *p_Var2;
  string local_88;
  string local_68;
  string local_48;
  
  this = "(";
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_48,(_anonymous_namespace_ *)this,v->r);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_48._M_dataplus._M_p,local_48._M_string_length);
  p_Var2 = (_anonymous_namespace_ *)0x1d83fc;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_68,p_Var2,v->g);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
  p_Var2 = (_anonymous_namespace_ *)0x1d83fc;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_88,p_Var2,v->b);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color3d &v) {
  os << "(" << tinyusdz::dtos(v.r) << ", " << tinyusdz::dtos(v.g) << ", "
     << tinyusdz::dtos(v.b) << ")";
  return os;
}